

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int dwarf_fileline(backtrace_state *state,uintptr_t pc,backtrace_full_callback callback,
                  backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  dwarf_data **pp;
  int ret;
  int found;
  dwarf_data *ddata;
  void *data_local;
  backtrace_error_callback error_callback_local;
  backtrace_full_callback callback_local;
  uintptr_t pc_local;
  backtrace_state *state_local;
  
  ddata = (dwarf_data *)data;
  data_local = error_callback;
  error_callback_local = (backtrace_error_callback)callback;
  callback_local = (backtrace_full_callback)pc;
  pc_local = (uintptr_t)state;
  if (state->threaded != 0) {
    abort();
  }
  _ret = (dwarf_data *)state->fileline_data;
  while( true ) {
    if (_ret == (dwarf_data *)0x0) {
      iVar1 = (*error_callback_local)(ddata,(char *)callback_local,0);
      return iVar1;
    }
    iVar1 = dwarf_lookup_pc((backtrace_state *)pc_local,_ret,(uintptr_t)callback_local,
                            (backtrace_full_callback)error_callback_local,
                            (backtrace_error_callback)data_local,ddata,(int *)((long)&pp + 4));
    if (iVar1 != 0) break;
    if (pp._4_4_ != 0) {
      return 0;
    }
    _ret = _ret->next;
    pp._0_4_ = 0;
  }
  return iVar1;
}

Assistant:

static int
dwarf_fileline (struct backtrace_state *state, uintptr_t pc,
		backtrace_full_callback callback,
		backtrace_error_callback error_callback, void *data)
{
  struct dwarf_data *ddata;
  int found;
  int ret;

  if (!state->threaded)
    {
      for (ddata = (struct dwarf_data *) state->fileline_data;
	   ddata != NULL;
	   ddata = ddata->next)
	{
	  ret = dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				 data, &found);
	  if (ret != 0 || found)
	    return ret;
	}
    }
  else
    {
      struct dwarf_data **pp;

      pp = (struct dwarf_data **) (void *) &state->fileline_data;
      while (1)
	{
	  ddata = backtrace_atomic_load_pointer (pp);
	  if (ddata == NULL)
	    break;

	  ret = dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				 data, &found);
	  if (ret != 0 || found)
	    return ret;

	  pp = &ddata->next;
	}
    }

  /* FIXME: See if any libraries have been dlopen'ed.  */

  return callback (data, pc, NULL, 0, NULL);
}